

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (params->nbWorkers != 0) {
    return 0xffffffffffffffff;
  }
  sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams(params);
  uVar1 = (params->cParams).windowLog;
  uVar4 = 1L << ((byte)uVar1 & 0x3f);
  uVar3 = 0x20000;
  if (uVar1 < 0x12) {
    uVar3 = uVar4;
  }
  uVar5 = 0;
  if (uVar3 < 0x20000) {
    uVar5 = -(uVar3 - 0x20000) >> 0xb;
  }
  return uVar4 + sVar2 + (uVar3 >> 8) + uVar3 * 2 + uVar5 + 1;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   size_t const CCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(params);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << params->cParams.windowLog);
        size_t const inBuffSize = ((size_t)1 << params->cParams.windowLog) + blockSize;
        size_t const outBuffSize = ZSTD_compressBound(blockSize) + 1;
        size_t const streamingSize = inBuffSize + outBuffSize;

        return CCtxSize + streamingSize;
    }
}